

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

arith_uint256 * __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::GetAntiDoSWorkThreshold(PeerManagerImpl *this)

{
  long lVar1;
  CBlockIndex *pCVar2;
  base_uint<256U> *a;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  arith_uint256 near_chaintip_work;
  ChainstateManager *in_stack_fffffffffffffe88;
  arith_uint256 *in_stack_fffffffffffffe90;
  CBlockIndex *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea8;
  arith_uint256 *b;
  char *in_stack_fffffffffffffeb0;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  mutexIn = in_RDI;
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffe88,0x2c96ce);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(uVar3,in_stack_fffffffffffffec8),mutexIn,(char *)in_RDI,
             in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  ChainstateManager::ActiveChain(in_stack_fffffffffffffe88);
  pCVar2 = CChain::Tip((CChain *)in_stack_fffffffffffffe98);
  if (pCVar2 != (CBlockIndex *)0x0) {
    a = (base_uint<256U> *)ChainstateManager::ActiveChain(in_stack_fffffffffffffe88);
    pCVar2 = CChain::Tip((CChain *)in_stack_fffffffffffffe98);
    b = &pCVar2->nChainWork;
    base_uint<256U>::base_uint
              ((base_uint<256U> *)in_stack_fffffffffffffe98,(uint64_t)in_stack_fffffffffffffe90);
    GetBlockProof(in_stack_fffffffffffffe98);
    ::operator*(a,&b->super_base_uint<256U>);
    arith_uint256::arith_uint256
              ((arith_uint256 *)in_stack_fffffffffffffe88,(base_uint<256U> *)0x2c97c0);
    std::min<arith_uint256>(in_stack_fffffffffffffe90,(arith_uint256 *)in_stack_fffffffffffffe88);
    ::operator-(a,&b->super_base_uint<256U>);
    arith_uint256::arith_uint256
              ((arith_uint256 *)in_stack_fffffffffffffe88,(base_uint<256U> *)0x2c980d);
    arith_uint256::operator=((arith_uint256 *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  }
  ChainstateManager::MinimumChainWork(in_stack_fffffffffffffe88);
  std::max<arith_uint256>(in_stack_fffffffffffffe90,(arith_uint256 *)in_stack_fffffffffffffe88);
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffe88,(arith_uint256 *)0x2c9889)
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (arith_uint256 *)mutexIn;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 PeerManagerImpl::GetAntiDoSWorkThreshold()
{
    arith_uint256 near_chaintip_work = 0;
    LOCK(cs_main);
    if (m_chainman.ActiveChain().Tip() != nullptr) {
        const CBlockIndex *tip = m_chainman.ActiveChain().Tip();
        // Use a 144 block buffer, so that we'll accept headers that fork from
        // near our tip.
        near_chaintip_work = tip->nChainWork - std::min<arith_uint256>(144*GetBlockProof(*tip), tip->nChainWork);
    }
    return std::max(near_chaintip_work, m_chainman.MinimumChainWork());
}